

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

Maybe<capnp::InterfaceSchema::Method> * __thiscall
capnp::InterfaceSchema::findMethodByName
          (Maybe<capnp::InterfaceSchema::Method> *__return_storage_ptr__,InterfaceSchema *this,
          StringPtr name,uint *counter)

{
  uint uVar1;
  RawSchema *pRVar2;
  bool bVar3;
  Schema SVar4;
  uint uVar5;
  uint uVar6;
  Arena *id;
  uint uVar7;
  unsigned_long i;
  ulong uVar8;
  StringPtr name_00;
  Reader superclass;
  Fault f;
  Reader superclasses;
  ArrayPtr<const_char> local_120;
  RawBrandedSchema *local_110;
  uint *local_108;
  RawSchema *local_100;
  StringPtr local_f8;
  undefined1 local_e8 [40];
  WirePointer *pWStack_c0;
  NullableValue<capnp::InterfaceSchema::Method> local_b8;
  MethodList local_68;
  
  name_00.content.size_ = name.content.size_;
  uVar1 = *counter;
  *counter = uVar1 + 1;
  local_108 = counter;
  if (uVar1 < 0x40) {
    pRVar2 = ((this->super_Schema).raw)->generic;
    getMethods(&local_68,this);
    uVar1 = pRVar2->memberCount;
    uVar5 = 0;
    local_110 = (RawBrandedSchema *)name.content.ptr;
    local_100 = pRVar2;
    local_f8.content.ptr = name.content.ptr;
    local_f8.content.size_ = name_00.content.size_;
    while (uVar6 = uVar1, uVar5 < uVar6) {
      MethodList::operator[]
                ((Method *)&local_b8,&local_68,
                 (uint)*(ushort *)
                        ((long)local_100->membersByName + (ulong)(uVar5 + uVar6 & 0xfffffffe)));
      local_e8._32_8_ = local_b8.field_1.value.proto._reader.pointers;
      pWStack_c0 = (WirePointer *)local_b8.field_1._48_8_;
      local_e8._16_8_ = local_b8.field_1.value.proto._reader.capTable;
      local_e8._24_8_ = local_b8.field_1.value.proto._reader.data;
      local_e8._0_8_ = local_b8.field_1._8_8_;
      local_e8._8_8_ = local_b8.field_1.value.proto._reader.segment;
      local_120 = (ArrayPtr<const_char>)capnp::schema::Method::Reader::getName((Reader *)local_e8);
      bVar3 = kj::StringPtr::operator==((StringPtr *)&local_120,&local_f8);
      if (bVar3) {
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.parent.super_Schema.raw =
             (RawBrandedSchema *)local_b8._0_8_;
        ((InterfaceSchema *)((long)&(__return_storage_ptr__->ptr).field_1 + 8))->super_Schema =
             (Schema)local_b8.field_1.value.parent.super_Schema.raw;
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.segment =
             (SegmentReader *)local_b8.field_1._8_8_;
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.capTable =
             (CapTableReader *)local_b8.field_1.value.proto._reader.segment;
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.data =
             local_b8.field_1.value.proto._reader.capTable;
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.pointers =
             (WirePointer *)local_b8.field_1.value.proto._reader.data;
        *(WirePointer **)&(__return_storage_ptr__->ptr).field_1.value.proto._reader.dataSize =
             local_b8.field_1.value.proto._reader.pointers;
        *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.proto._reader.nestingLimit =
             local_b8.field_1._48_8_;
        return __return_storage_ptr__;
      }
      uVar7 = uVar5 + uVar6 >> 1;
      bVar3 = kj::StringPtr::operator<((StringPtr *)&local_120,&local_f8);
      uVar1 = uVar7;
      if (bVar3) {
        uVar1 = uVar6;
        uVar5 = uVar7 + 1;
      }
    }
    (__return_storage_ptr__->ptr).isSet = false;
    Schema::getProto((Reader *)local_e8,&this->super_Schema);
    local_b8.field_1.value.proto._reader.capTable = (CapTableReader *)local_e8._32_8_;
    local_b8.field_1.value.proto._reader.data = pWStack_c0;
    local_b8.field_1._8_8_ = local_e8._16_8_;
    local_b8.field_1.value.proto._reader.segment = (SegmentReader *)local_e8._24_8_;
    local_b8._0_8_ = local_e8._0_8_;
    local_b8.field_1.value.parent.super_Schema.raw =
         (InterfaceSchema)(InterfaceSchema)local_e8._8_8_;
    capnp::schema::Node::Interface::Reader::getSuperclasses((Reader *)&local_68,(Reader *)&local_b8)
    ;
    uVar8 = 0;
    do {
      if ((uint)local_68.list.reader.ptr == uVar8) {
        return __return_storage_ptr__;
      }
      _::ListReader::getStructElement
                ((StructReader *)local_e8,(ListReader *)&local_68,(ElementCount)uVar8);
      if ((uint)local_e8._32_4_ < 0x40) {
        id = (Arena *)0x0;
      }
      else {
        id = *(Arena **)local_e8._16_8_;
      }
      SVar4 = Schema::getDependency
                        (&this->super_Schema,(uint64_t)id,(ElementCount)uVar8 | 0x4000000);
      local_120.ptr = (char *)SVar4.raw;
      local_f8.content.ptr = (char *)Schema::asInterface((Schema *)&local_120);
      name_00.content.ptr = (char *)local_110;
      findMethodByName((Maybe<capnp::InterfaceSchema::Method> *)&local_b8,
                       (InterfaceSchema *)&local_f8,name_00,local_108);
      kj::_::NullableValue<capnp::InterfaceSchema::Method>::operator=
                (&__return_storage_ptr__->ptr,&local_b8);
      uVar8 = uVar8 + 1;
    } while ((__return_storage_ptr__->ptr).isSet != true);
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[53]>
              ((Fault *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x232,FAILED,"counter++ < MAX_SUPERCLASSES",
               "\"Cyclic or absurdly-large inheritance graph detected.\"",
               (char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    (__return_storage_ptr__->ptr).isSet = false;
    kj::_::Debug::Fault::~Fault((Fault *)&local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<InterfaceSchema::Method> InterfaceSchema::findMethodByName(
    kj::StringPtr name, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return nullptr;
  }

  auto result = findSchemaMemberByName(raw->generic, name, getMethods());

  if (result == nullptr) {
    // Search superclasses.
    // TODO(perf):  This may be somewhat slow, and in the case of lots of diamond dependencies it
    //   could get pathological.  Arguably we should generate a flat list of transitive
    //   superclasses to search and store it in the RawSchema.  It's problematic, though, because
    //   this means that a dynamically-loaded RawSchema cannot be correctly constructed until all
    //   superclasses have been loaded, which imposes an ordering requirement on SchemaLoader or
    //   requires updating subclasses whenever a new superclass is loaded.
    auto superclasses = getProto().getInterface().getSuperclasses();
    for (auto i: kj::indices(superclasses)) {
      auto superclass = superclasses[i];
      uint location = _::RawBrandedSchema::makeDepLocation(
          _::RawBrandedSchema::DepKind::SUPERCLASS, i);
      result = getDependency(superclass.getId(), location)
          .asInterface().findMethodByName(name, counter);
      if (result != nullptr) {
        break;
      }
    }
  }

  return result;
}